

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsCliqueTable.cpp
# Opt level: O0

bool __thiscall
HighsCliqueTable::foundCover
          (HighsCliqueTable *this,HighsDomain *globaldom,CliqueVar v1,CliqueVar v2)

{
  int iVar1;
  Reason reason;
  bool bVar2;
  HighsInt HVar3;
  reference pvVar4;
  HighsInt in_EDX;
  HighsDomain *in_RSI;
  vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_> *in_RDI;
  bool bVar5;
  bool wasfixed;
  HighsInt i;
  HighsInt end;
  HighsInt start;
  HighsInt commonclique;
  bool equality;
  HighsDomain *in_stack_000000a8;
  HighsCliqueTable *in_stack_000000b0;
  HighsCliqueTable *in_stack_ffffffffffffff78;
  CliqueVar *in_stack_ffffffffffffff80;
  HighsDomain *__args;
  HighsDomain *in_stack_ffffffffffffff90;
  HighsInt in_stack_ffffffffffffffb4;
  Reason in_stack_ffffffffffffffb8;
  uint in_stack_ffffffffffffffc0;
  int local_28;
  
  local_28 = findCommonCliqueId(in_stack_ffffffffffffff78,
                                SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0),
                                SUB84(in_stack_ffffffffffffff80,0));
  bVar5 = local_28 != -1;
  do {
    if (local_28 == -1) {
      processInfeasibleVertices(in_stack_000000b0,in_stack_000000a8);
      return bVar5;
    }
    pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         *)&in_RDI[7].
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_28);
    HVar3 = pvVar4->start;
    pvVar4 = std::vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>::
             operator[]((vector<HighsCliqueTable::Clique,_std::allocator<HighsCliqueTable::Clique>_>
                         *)&in_RDI[7].
                            super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)local_28);
    iVar1 = pvVar4->end;
    for (; HVar3 != iVar1; HVar3 = HVar3 + 1) {
      std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
      operator[](in_RDI,(long)HVar3);
      bVar2 = CliqueVar::operator==
                        (in_stack_ffffffffffffff80,(CliqueVar *)in_stack_ffffffffffffff78);
      if (!bVar2) {
        std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
        operator[](in_RDI,(long)HVar3);
        bVar2 = CliqueVar::operator==
                          (in_stack_ffffffffffffff80,(CliqueVar *)in_stack_ffffffffffffff78);
        if (!bVar2) {
          __args = in_RSI;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          operator[](in_RDI,(long)HVar3);
          bVar2 = HighsDomain::isFixed(in_stack_ffffffffffffff90,(HighsInt)((ulong)__args >> 0x20));
          in_stack_ffffffffffffffc0 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffffc0);
          in_stack_ffffffffffffff90 = in_RSI;
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          operator[](in_RDI,(long)HVar3);
          std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
          operator[](in_RDI,(long)HVar3);
          in_stack_ffffffffffffffb8 = HighsDomain::Reason::unspecified();
          reason.index = HVar3;
          reason.type = in_stack_ffffffffffffffc0;
          HighsDomain::fixCol((HighsDomain *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,
                              (double)in_RDI,reason);
          bVar2 = HighsDomain::infeasible(in_RSI);
          if (bVar2) {
            return bVar5;
          }
          if ((in_stack_ffffffffffffffc0 & 0x1000000) == 0) {
            *(int *)&in_RDI[0x13].
                     super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                     ._M_impl.super__Vector_impl_data._M_start =
                 *(int *)&in_RDI[0x13].
                          super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                          ._M_impl.super__Vector_impl_data._M_start + 1;
            in_stack_ffffffffffffff80 =
                 (CliqueVar *)
                 &in_RDI[9].
                  super__Vector_base<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
            std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>::
            operator[](in_RDI,(long)HVar3);
            std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>::
            emplace_back<HighsCliqueTable::CliqueVar&>
                      ((vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>
                        *)in_stack_ffffffffffffff90,(CliqueVar *)__args);
          }
        }
      }
    }
    removeClique((HighsCliqueTable *)CONCAT44(HVar3,in_stack_ffffffffffffffc0),
                 in_stack_ffffffffffffffb8.index);
    in_stack_ffffffffffffffb4 = in_EDX;
    local_28 = findCommonCliqueId(in_stack_ffffffffffffff78,
                                  SUB84((ulong)in_stack_ffffffffffffff80 >> 0x20,0),
                                  SUB84(in_stack_ffffffffffffff80,0));
  } while( true );
}

Assistant:

bool HighsCliqueTable::foundCover(HighsDomain& globaldom, CliqueVar v1,
                                  CliqueVar v2) {
  bool equality = false;
  HighsInt commonclique = findCommonCliqueId(v1, v2);
  if (commonclique != -1) equality = true;

  while (commonclique != -1) {
    HighsInt start = cliques[commonclique].start;
    HighsInt end = cliques[commonclique].end;

    for (HighsInt i = start; i != end; ++i) {
      if (cliqueentries[i] == v1 || cliqueentries[i] == v2) continue;

      bool wasfixed = globaldom.isFixed(cliqueentries[i].col);
      globaldom.fixCol(cliqueentries[i].col, 1 - cliqueentries[i].val);
      if (globaldom.infeasible()) return equality;
      if (!wasfixed) {
        ++nfixings;
        infeasvertexstack.emplace_back(cliqueentries[i]);
      }
    }

    removeClique(commonclique);
    commonclique = findCommonCliqueId(v1, v2);
  }

  processInfeasibleVertices(globaldom);

  return equality;
}